

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

bool __thiscall cmListFileParser::ParseFile(cmListFileParser *this)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  cmListFileLexer_Token *pcVar4;
  char *pcVar5;
  string local_508 [32];
  ostringstream local_4e8 [8];
  ostringstream error_1;
  string local_370 [32];
  ostringstream local_350 [8];
  ostringstream error;
  cmListFileLexer_Token *token;
  undefined1 local_1c8 [7];
  bool haveNewline;
  ostringstream local_198 [8];
  ostringstream m;
  cmListFileLexer_BOM local_1c;
  cmListFileParser *pcStack_18;
  cmListFileLexer_BOM bom;
  cmListFileParser *this_local;
  
  pcStack_18 = this;
  iVar2 = cmListFileLexer_SetFileName(this->Lexer,this->FileName,&local_1c);
  if (iVar2 == 0) {
    cmSystemTools::Error
              ("cmListFileCache: error can not open file ",this->FileName,(char *)0x0,(char *)0x0);
    this_local._7_1_ = 0;
  }
  else if ((local_1c == cmListFileLexer_BOM_None) || (local_1c == cmListFileLexer_BOM_UTF8)) {
    bVar1 = true;
    while (pcVar4 = cmListFileLexer_Scan(this->Lexer), pcVar4 != (cmListFileLexer_Token *)0x0) {
      if (pcVar4->type != cmListFileLexer_Token_Space) {
        if (pcVar4->type == cmListFileLexer_Token_Newline) {
          bVar1 = true;
        }
        else {
          if (pcVar4->type != cmListFileLexer_Token_CommentBracket) {
            if (pcVar4->type != cmListFileLexer_Token_Identifier) {
              std::__cxx11::ostringstream::ostringstream(local_4e8);
              poVar3 = std::operator<<((ostream *)local_4e8,"Error in cmake code at\n");
              poVar3 = std::operator<<(poVar3,this->FileName);
              poVar3 = std::operator<<(poVar3,":");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,pcVar4->line);
              poVar3 = std::operator<<(poVar3,":\n");
              poVar3 = std::operator<<(poVar3,"Parse error.  Expected a command name, got ");
              pcVar5 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar4->type);
              poVar3 = std::operator<<(poVar3,pcVar5);
              poVar3 = std::operator<<(poVar3," with text \"");
              poVar3 = std::operator<<(poVar3,pcVar4->text);
              std::operator<<(poVar3,"\".");
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmSystemTools::Error(pcVar5,(char *)0x0,(char *)0x0,(char *)0x0);
              std::__cxx11::string::~string(local_508);
              this_local._7_1_ = 0;
              std::__cxx11::ostringstream::~ostringstream(local_4e8);
              goto LAB_0085a5b1;
            }
            if (!bVar1) {
              std::__cxx11::ostringstream::ostringstream(local_350);
              poVar3 = std::operator<<((ostream *)local_350,"Error in cmake code at\n");
              poVar3 = std::operator<<(poVar3,this->FileName);
              poVar3 = std::operator<<(poVar3,":");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,pcVar4->line);
              poVar3 = std::operator<<(poVar3,":\n");
              poVar3 = std::operator<<(poVar3,"Parse error.  Expected a newline, got ");
              pcVar5 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar4->type);
              poVar3 = std::operator<<(poVar3,pcVar5);
              poVar3 = std::operator<<(poVar3," with text \"");
              poVar3 = std::operator<<(poVar3,pcVar4->text);
              std::operator<<(poVar3,"\".");
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmSystemTools::Error(pcVar5,(char *)0x0,(char *)0x0,(char *)0x0);
              std::__cxx11::string::~string(local_370);
              this_local._7_1_ = 0;
              std::__cxx11::ostringstream::~ostringstream(local_350);
              goto LAB_0085a5b1;
            }
            bVar1 = ParseFunction(this,pcVar4->text,(long)pcVar4->line);
            if (!bVar1) {
              this_local._7_1_ = 0;
              goto LAB_0085a5b1;
            }
            std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
                      (&this->ListFile->Functions,&this->Function);
          }
          bVar1 = false;
        }
      }
    }
    this_local._7_1_ = 1;
  }
  else {
    cmListFileLexer_SetFileName(this->Lexer,(char *)0x0,(cmListFileLexer_BOM *)0x0);
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = std::operator<<((ostream *)local_198,"File\n  ");
    poVar3 = std::operator<<(poVar3,this->FileName);
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"starts with a Byte-Order-Mark that is not UTF-8.");
    this_00 = this->Makefile;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)local_1c8);
    std::__cxx11::string::~string((string *)local_1c8);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
LAB_0085a5b1:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmListFileParser::ParseFile()
{
  // Open the file.
  cmListFileLexer_BOM bom;
  if(!cmListFileLexer_SetFileName(this->Lexer, this->FileName, &bom))
    {
    cmSystemTools::Error("cmListFileCache: error can not open file ",
                         this->FileName);
    return false;
    }

  // Verify the Byte-Order-Mark, if any.
  if(bom != cmListFileLexer_BOM_None &&
     bom != cmListFileLexer_BOM_UTF8)
    {
    cmListFileLexer_SetFileName(this->Lexer, 0, 0);
    std::ostringstream m;
    m << "File\n  " << this->FileName << "\n"
      << "starts with a Byte-Order-Mark that is not UTF-8.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, m.str());
    return false;
    }

  // Use a simple recursive-descent parser to process the token
  // stream.
  bool haveNewline = true;
  while(cmListFileLexer_Token* token =
        cmListFileLexer_Scan(this->Lexer))
    {
    if(token->type == cmListFileLexer_Token_Space)
      {
      }
    else if(token->type == cmListFileLexer_Token_Newline)
      {
      haveNewline = true;
      }
    else if(token->type == cmListFileLexer_Token_CommentBracket)
      {
      haveNewline = false;
      }
    else if(token->type == cmListFileLexer_Token_Identifier)
      {
      if(haveNewline)
        {
        haveNewline = false;
        if(this->ParseFunction(token->text, token->line))
          {
          this->ListFile->Functions.push_back(this->Function);
          }
        else
          {
          return false;
          }
        }
      else
        {
        std::ostringstream error;
        error << "Error in cmake code at\n"
              << this->FileName << ":" << token->line << ":\n"
              << "Parse error.  Expected a newline, got "
              << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
              << " with text \"" << token->text << "\".";
        cmSystemTools::Error(error.str().c_str());
        return false;
        }
      }
    else
      {
      std::ostringstream error;
      error << "Error in cmake code at\n"
            << this->FileName << ":" << token->line << ":\n"
            << "Parse error.  Expected a command name, got "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \""
            << token->text << "\".";
      cmSystemTools::Error(error.str().c_str());
      return false;
      }
    }
  return true;
}